

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

void Gia_ManSeqEquivDivide(Gia_Man_t *p,Cec_ParCor_t *pPars)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  Gia_Man_t *pAig;
  uint *puVar4;
  ulong uVar5;
  bool bVar6;
  int fSecond;
  Gia_Man_t **ppGVar7;
  Gia_Man_t *pParts [2];
  Gia_Man_t *local_48;
  Gia_Man_t *local_40 [2];
  
  ppGVar7 = &local_48;
  fSecond = 0;
  bVar6 = true;
  do {
    pAig = Gia_ManDupHalfSeq(p,fSecond);
    *ppGVar7 = pAig;
    Cec_ManLSCorrespondenceClasses(pAig,pPars);
    uVar1 = p->nObjs;
    if ((0 < (int)uVar1) && (p->pObjs != (Gia_Obj_t *)0x0)) {
      puVar4 = &p->pObjs->Value;
      uVar5 = 0;
      do {
        uVar2 = *puVar4;
        if (uVar2 != 0xffffffff) {
          if ((int)uVar2 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          if (pAig->nObjs <= (int)(uVar2 >> 1)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pAig->pObjs[uVar2 >> 1].Value = (uint)uVar5;
        }
        uVar5 = uVar5 + 1;
        puVar4 = puVar4 + 3;
      } while (uVar1 != uVar5);
    }
    fSecond = 1;
    ppGVar7 = local_40;
    bVar3 = !bVar6;
    bVar6 = false;
    if (bVar3) {
      Gia_ManSeqEquivMerge(p,&local_48);
      Gia_ManStop(local_48);
      Gia_ManStop(local_40[0]);
      return;
    }
  } while( true );
}

Assistant:

void Gia_ManSeqEquivDivide( Gia_Man_t * p, Cec_ParCor_t * pPars )
{
    Gia_Man_t * pParts[2];
    Gia_Obj_t * pObj;
    int n, i;
    for ( n = 0; n < 2; n++ )
    {
        // derive n-th part of the AIG
        pParts[n] = Gia_ManDupHalfSeq( p, n );
        //Gia_ManPrintStats( pParts[n], NULL );
        // compute equivalences (recorded internally using pReprs and pNexts)
        Cec_ManLSCorrespondenceClasses( pParts[n], pPars );
        // make the nodes of the part AIG point to their prototypes in the AIG
        Gia_ManForEachObj( p, pObj, i )
            if ( ~pObj->Value )
                Gia_ManObj( pParts[n], Abc_Lit2Var(pObj->Value) )->Value = i;
    }
    Gia_ManSeqEquivMerge( p, pParts );
    Gia_ManStop( pParts[0] );
    Gia_ManStop( pParts[1] );
}